

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall CLIntercept::checkTimingEvents(CLIntercept *this)

{
  _List_node_base *p_Var1;
  int iVar2;
  cl_int cVar3;
  cl_int cVar4;
  cl_int cVar5;
  cl_int cVar6;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar7;
  ostream *poVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  _List_node_base *this_01;
  iterator __position;
  ulong uVar12;
  float __x;
  double dVar13;
  cl_int eventStatus;
  cl_ulong commandStart;
  cl_ulong commandEnd;
  cl_ulong commandSubmit;
  cl_ulong commandQueued;
  pthread_mutex_t *local_1f8;
  undefined1 *local_1f0;
  undefined1 local_1e0 [16];
  cl_ulong local_1d0;
  cl_ulong local_1c8;
  key_type *local_1c0;
  CDeviceDeviceTimingStatsMap *local_1b8;
  _List_node_base *local_1b0;
  ostringstream ss;
  ios_base local_138 [264];
  
  local_1f8 = (pthread_mutex_t *)&this->m_Mutex;
  iVar2 = pthread_mutex_lock(local_1f8);
  if (iVar2 != 0) {
    uVar9 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock(local_1f8);
    _Unwind_Resume(uVar9);
  }
  this_01 = (_List_node_base *)&this->m_EventList;
  __position._M_node =
       (this->m_EventList).
       super__List_base<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  if (__position._M_node != this_01) {
    local_1b8 = &this->m_DeviceTimingStatsMap;
    local_1b0 = this_01;
    do {
      eventStatus = 0;
      p_Var1 = (__position._M_node)->_M_next;
      cVar3 = (*(this->m_Dispatch).clGetEventInfo)
                        ((cl_event)__position._M_node[6]._M_next,0x11d3,4,&eventStatus,(size_t *)0x0
                        );
      if (cVar3 == -0x3a) {
        logf(this,__x);
LAB_00179f5b:
        std::__cxx11::
        list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>::_M_erase
                  ((list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>
                    *)this_01,__position);
      }
      else if ((cVar3 == 0) && (eventStatus == 0)) {
        if (((this->m_Config).DevicePerformanceTiming != false) ||
           (((this->m_Config).ITTPerformanceTiming != false ||
            ((this->m_Config).ChromePerformanceTiming == true)))) {
          commandQueued = 0;
          commandSubmit = 0;
          commandStart = 0;
          commandEnd = 0;
          cVar3 = (*(this->m_Dispatch).clGetEventProfilingInfo)
                            ((cl_event)__position._M_node[6]._M_next,0x1280,8,&commandQueued,
                             (size_t *)0x0);
          cVar4 = (*(this->m_Dispatch).clGetEventProfilingInfo)
                            ((cl_event)__position._M_node[6]._M_next,0x1281,8,&commandSubmit,
                             (size_t *)0x0);
          cVar5 = (*(this->m_Dispatch).clGetEventProfilingInfo)
                            ((cl_event)__position._M_node[6]._M_next,0x1282,8,&commandStart,
                             (size_t *)0x0);
          cVar6 = (*(this->m_Dispatch).clGetEventProfilingInfo)
                            ((cl_event)__position._M_node[6]._M_next,0x1283,8,&commandEnd,
                             (size_t *)0x0);
          this_01 = local_1b0;
          if (((cVar4 == 0 && cVar3 == 0) && cVar5 == 0) && cVar6 == 0) {
            uVar12 = commandEnd - commandStart;
            this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)std::
                         map<_cl_device_id_*,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>_>
                         ::operator[](local_1b8,(key_type *)(__position._M_node + 1));
            local_1c0 = (key_type *)(__position._M_node + 2);
            pmVar7 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](this_00,local_1c0);
            pmVar7->NumberOfCalls = pmVar7->NumberOfCalls + 1;
            pmVar7->TotalNS = pmVar7->TotalNS + uVar12;
            uVar10 = pmVar7->MinNS;
            if (uVar12 < pmVar7->MinNS) {
              uVar10 = uVar12;
            }
            uVar11 = pmVar7->MaxNS;
            if (pmVar7->MaxNS <= uVar12) {
              uVar11 = uVar12;
            }
            pmVar7->MinNS = uVar10;
            pmVar7->MaxNS = uVar11;
            if ((this->m_Config).DevicePerformanceTimeLogging == true) {
              local_1d0 = commandSubmit;
              local_1c8 = commandStart;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss,"Device Time for ",0x10);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&ss,(char *)__position._M_node[2]._M_next,
                                  (long)__position._M_node[2]._M_prev);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," (enqueue ",10);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,") = ",4);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," ns (queued -> submit), ",0x18);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," ns (submit -> start), ",0x17);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," ns (start -> end)\n",0x13)
              ;
              dVar13 = (double)std::__cxx11::stringbuf::str();
              log(this,dVar13);
              if (local_1f0 != local_1e0) {
                operator_delete(local_1f0);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
              std::ios_base::~ios_base(local_138);
            }
            if ((this->m_Config).DevicePerformanceTimelineLogging == true) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&ss,"Device Timeline for ",0x14);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&ss,(char *)__position._M_node[2]._M_next,
                                  (long)__position._M_node[2]._M_prev);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," (enqueue ",10);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,") = ",4);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," ns (queued), ",0xe);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," ns (submit), ",0xe);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," ns (start), ",0xd);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," ns (end)\n",10);
              dVar13 = (double)std::__cxx11::stringbuf::str();
              log(this,dVar13);
              if (local_1f0 != local_1e0) {
                operator_delete(local_1f0);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
              std::ios_base::~ios_base(local_138);
            }
            this_01 = local_1b0;
            if ((this->m_Config).ChromePerformanceTiming == true) {
              chromeTraceEvent(this,local_1c0,
                               (bool)(((this->m_Config).ChromePerformanceTimingEstimateQueuedTime ^
                                      1U) & *(byte *)&__position._M_node[5]._M_next),
                               (int64_t)__position._M_node[5]._M_prev,
                               (uint64_t)__position._M_node[4]._M_next,
                               *(uint *)&__position._M_node[1]._M_prev,
                               (time_point)__position._M_node[4]._M_prev,commandQueued,commandSubmit
                               ,commandStart,commandEnd);
              this_01 = local_1b0;
            }
          }
        }
        if ((this->m_Config).DevicePerfCounterEventBasedSampling == true) {
          getMDAPICountersFromEvent
                    (this,(string *)(__position._M_node + 2),(cl_event)__position._M_node[6]._M_next
                    );
        }
        (*(this->m_Dispatch).clReleaseEvent)((cl_event)__position._M_node[6]._M_next);
        goto LAB_00179f5b;
      }
      __position._M_node = p_Var1;
    } while (p_Var1 != this_01);
  }
  if ((this->m_Config).DevicePerfCounterTimeBasedSampling == true) {
    getMDAPICountersFromStream(this);
  }
  pthread_mutex_unlock(local_1f8);
  return;
}

Assistant:

void CLIntercept::checkTimingEvents()
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CEventList::iterator    current = m_EventList.begin();
    CEventList::iterator    next;

    while( current != m_EventList.end() )
    {
        cl_int  errorCode = CL_SUCCESS;
        cl_int  eventStatus = 0;

        next = current;
        ++next;

        const SEventListNode& node = *current;

        errorCode = dispatch().clGetEventInfo(
            node.Event,
            CL_EVENT_COMMAND_EXECUTION_STATUS,
            sizeof( eventStatus ),
            &eventStatus,
            NULL );

        switch( errorCode )
        {
        case CL_SUCCESS:
            if( eventStatus == CL_COMPLETE )
            {
                if( config().DevicePerformanceTiming ||
                    config().ITTPerformanceTiming ||
                    config().ChromePerformanceTiming )
                {
                    cl_ulong    commandQueued = 0;
                    cl_ulong    commandSubmit = 0;
                    cl_ulong    commandStart = 0;
                    cl_ulong    commandEnd = 0;

                    errorCode |= dispatch().clGetEventProfilingInfo(
                        node.Event,
                        CL_PROFILING_COMMAND_QUEUED,
                        sizeof( commandQueued ),
                        &commandQueued,
                        NULL );
                    errorCode |= dispatch().clGetEventProfilingInfo(
                        node.Event,
                        CL_PROFILING_COMMAND_SUBMIT,
                        sizeof( commandSubmit ),
                        &commandSubmit,
                        NULL );
                    errorCode |= dispatch().clGetEventProfilingInfo(
                        node.Event,
                        CL_PROFILING_COMMAND_START,
                        sizeof( commandStart ),
                        &commandStart,
                        NULL );
                    errorCode |= dispatch().clGetEventProfilingInfo(
                        node.Event,
                        CL_PROFILING_COMMAND_END,
                        sizeof( commandEnd ),
                        &commandEnd,
                        NULL );
                    if( errorCode == CL_SUCCESS )
                    {
                        cl_ulong delta = commandEnd - commandStart;

                        SDeviceTimingStats& deviceTimingStats = m_DeviceTimingStatsMap[node.Device][node.Name];

                        deviceTimingStats.NumberOfCalls++;
                        deviceTimingStats.TotalNS += delta;
                        deviceTimingStats.MinNS = std::min< cl_ulong >( deviceTimingStats.MinNS, delta );
                        deviceTimingStats.MaxNS = std::max< cl_ulong >( deviceTimingStats.MaxNS, delta );

                        //uint64_t    numberOfCalls = deviceTimingStats.NumberOfCalls;

                        if( config().DevicePerformanceTimeLogging )
                        {
                            cl_ulong    queuedDelta = commandSubmit - commandQueued;
                            cl_ulong    submitDelta = commandStart - commandSubmit;

                            std::ostringstream  ss;

                            ss << "Device Time for "
                                //<< "call " << numberOfCalls << " to "
                                << node.Name << " (enqueue " << node.EnqueueCounter << ") = "
                                << queuedDelta << " ns (queued -> submit), "
                                << submitDelta << " ns (submit -> start), "
                                << delta << " ns (start -> end)\n";

                            log( ss.str() );
                        }

                        if( config().DevicePerformanceTimelineLogging )
                        {
                            std::ostringstream  ss;

                            ss << "Device Timeline for "
                                //<< "call " << numberOfCalls << " to "
                                << node.Name << " (enqueue " << node.EnqueueCounter << ") = "
                                << commandQueued << " ns (queued), "
                                << commandSubmit << " ns (submit), "
                                << commandStart << " ns (start), "
                                << commandEnd << " ns (end)\n";

                            log( ss.str() );
                        }

#if defined(USE_ITT)
                        if( config().ITTPerformanceTiming )
                        {
                            ittTraceEvent(
                                node.Name,
                                node.Event,
                                node.QueuedTime,
                                commandQueued,
                                commandSubmit,
                                commandStart,
                                commandEnd );
                        }
#endif

                        if( config().ChromePerformanceTiming )
                        {
                            bool useProfilingDelta =
                                node.UseProfilingDelta &&
                                !config().ChromePerformanceTimingEstimateQueuedTime;

                            chromeTraceEvent(
                                node.Name,
                                useProfilingDelta,
                                node.ProfilingDeltaNS,
                                node.EnqueueCounter,
                                node.QueueNumber,
                                node.QueuedTime,
                                commandQueued,
                                commandSubmit,
                                commandStart,
                                commandEnd );
                        }
                    }
                }

#if defined(USE_MDAPI)
                if( config().DevicePerfCounterEventBasedSampling )
                {
                    getMDAPICountersFromEvent(
                        node.Name,
                        node.Event );
                }
#endif

                dispatch().clReleaseEvent( node.Event );

                m_EventList.erase( current );
            }
            break;
        case CL_INVALID_EVENT:
            {
                // This is unexpected.  We retained the event when we
                // added it to the list.  Remove the event from the
                // list.
                logf( "Unexpectedly got CL_INVALID_EVENT for an event from %s!\n",
                    node.Name.c_str() );

                m_EventList.erase( current );
            }
            break;
        default:
            // nothing
            break;
        }

        current = next;
    }

#if defined(USE_MDAPI)
    if( config().DevicePerfCounterTimeBasedSampling )
    {
        getMDAPICountersFromStream();
    }
#endif
}